

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O3

Vec_Ptr_t * Amap_LibertyCellOutputs(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  uint uVar1;
  Amap_Pair_t AVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Amap_Item_t *pAVar6;
  long lVar7;
  ulong uVar8;
  Amap_Item_t *pPin;
  int iVar9;
  
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 8;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(0x40);
  pVVar4->pArray = ppvVar5;
  uVar1 = pCell->Child;
  if ((int)uVar1 < p->nItems) {
    if ((-1 < (int)uVar1) && (p->pItems != (Amap_Item_t *)0x0)) {
      pPin = p->pItems + uVar1;
      iVar9 = 0;
      uVar8 = 8;
      do {
        AVar2 = pPin->Key;
        iVar3 = strncmp(p->pContents + AVar2.Beg,"pin",(long)AVar2 - ((long)AVar2 << 0x20) >> 0x20);
        if (iVar3 == 0) {
          pAVar6 = Amap_LibertyPinFunction(p,pPin);
          if (pAVar6 != (Amap_Item_t *)0x0) {
            iVar3 = (int)uVar8;
            if (iVar9 == iVar3) {
              if (iVar3 < 0x10) {
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
                }
                pVVar4->pArray = ppvVar5;
                pVVar4->nCap = 0x10;
                uVar8 = 0x10;
              }
              else {
                uVar8 = (ulong)(uint)(iVar3 * 2);
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(uVar8 * 8);
                }
                else {
                  ppvVar5 = (void **)realloc(pVVar4->pArray,uVar8 * 8);
                }
                pVVar4->pArray = ppvVar5;
                pVVar4->nCap = iVar3 * 2;
              }
            }
            else {
              ppvVar5 = pVVar4->pArray;
            }
            lVar7 = (long)iVar9;
            iVar9 = iVar9 + 1;
            pVVar4->nSize = iVar9;
            ppvVar5[lVar7] = pPin;
          }
        }
        uVar1 = pPin->Next;
        if (p->nItems <= (int)uVar1) goto LAB_003ade71;
      } while ((-1 < (int)uVar1) && (pPin = p->pItems + uVar1, p->pItems != (Amap_Item_t *)0x0));
    }
    return pVVar4;
  }
LAB_003ade71:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapLiberty.c"
                ,0x49,"Amap_Item_t *Amap_LibertyItem(Amap_Tree_t *, int)");
}

Assistant:

Vec_Ptr_t * Amap_LibertyCellOutputs( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pPin;
    Vec_Ptr_t * vOutPins;
    vOutPins = Vec_PtrAlloc( 2 );
    Amap_ItemForEachChild( p, pCell, pPin )
    {
        if ( Amap_LibertyCompare(p, pPin->Key, "pin") )
            continue;
        if ( Amap_LibertyPinFunction(p, pPin) )
            Vec_PtrPush( vOutPins, pPin );
    }
    return vOutPins;
}